

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O0

void __thiscall xray_re::xr_scene_lights::xr_scene_lights(xr_scene_lights *this,xr_scene *scene)

{
  float _x;
  float _y;
  xr_token local_a0;
  xr_token local_78;
  xr_token local_50;
  xr_scene *local_18;
  xr_scene *scene_local;
  xr_scene_lights *this_local;
  
  local_18 = scene;
  scene_local = (xr_scene *)this;
  xr_scene_objects::xr_scene_objects
            (&this->super_xr_scene_objects,scene,"light.part",SCENE_CHUNK_LIGHTS);
  (this->super_xr_scene_objects).super_xr_scene_part._vptr_xr_scene_part =
       (_func_int **)&PTR__xr_scene_lights_0038db08;
  this->m_flags = 0;
  std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::vector(&this->m_controls);
  _x = deg2rad<float>(-25.0);
  _y = deg2rad<float>(292.0);
  _vector2<float>::set(&this->m_sun,_x,_y);
  xr_token::xr_token(&local_50,"$static",0);
  std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::push_back
            (&this->m_controls,&local_50);
  xr_token::~xr_token(&local_50);
  xr_token::xr_token(&local_78,"$hemi",1);
  std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::push_back
            (&this->m_controls,&local_78);
  xr_token::~xr_token(&local_78);
  xr_token::xr_token(&local_a0,"$sun",2);
  std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::push_back
            (&this->m_controls,&local_a0);
  xr_token::~xr_token(&local_a0);
  return;
}

Assistant:

xr_scene_lights::xr_scene_lights(xr_scene& scene):
	xr_scene_objects(scene, "light.part", SCENE_CHUNK_LIGHTS),
	m_flags(0)
{
	m_sun.set(deg2rad(-25.f), deg2rad(292.f));
	m_controls.push_back(xr_token("$static", 0));
	m_controls.push_back(xr_token("$hemi", 1));
	m_controls.push_back(xr_token("$sun", 2));
}